

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elf-parser.cc
# Opt level: O0

string * __thiscall
elf_parser::Elf_parser::get_section_type_abi_cxx11_
          (string *__return_storage_ptr__,Elf_parser *this,int tt)

{
  allocator local_38;
  allocator local_37;
  allocator local_36;
  allocator local_35;
  allocator local_34;
  allocator local_33;
  allocator local_32;
  allocator local_31;
  allocator local_30;
  allocator local_2f;
  allocator local_2e;
  allocator local_2d [16];
  allocator local_1d;
  int local_1c;
  Elf_parser *pEStack_18;
  int tt_local;
  Elf_parser *this_local;
  
  local_1c = tt;
  pEStack_18 = this;
  this_local = (Elf_parser *)__return_storage_ptr__;
  if (tt < 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"UNKNOWN",&local_1d);
    std::allocator<char>::~allocator((allocator<char> *)&local_1d);
  }
  else {
    switch(tt) {
    case 0:
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)__return_storage_ptr__,"SHT_NULL",local_2d);
      std::allocator<char>::~allocator((allocator<char> *)local_2d);
      break;
    case 1:
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)__return_storage_ptr__,"SHT_PROGBITS",&local_2e);
      std::allocator<char>::~allocator((allocator<char> *)&local_2e);
      break;
    case 2:
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)__return_storage_ptr__,"SHT_SYMTAB",&local_2f);
      std::allocator<char>::~allocator((allocator<char> *)&local_2f);
      break;
    case 3:
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)__return_storage_ptr__,"SHT_STRTAB",&local_30);
      std::allocator<char>::~allocator((allocator<char> *)&local_30);
      break;
    case 4:
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)__return_storage_ptr__,"SHT_RELA",&local_31);
      std::allocator<char>::~allocator((allocator<char> *)&local_31);
      break;
    case 5:
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)__return_storage_ptr__,"SHT_HASH",&local_32);
      std::allocator<char>::~allocator((allocator<char> *)&local_32);
      break;
    case 6:
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)__return_storage_ptr__,"SHT_DYNAMIC",&local_33);
      std::allocator<char>::~allocator((allocator<char> *)&local_33);
      break;
    case 7:
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)__return_storage_ptr__,"SHT_NOTE",&local_34);
      std::allocator<char>::~allocator((allocator<char> *)&local_34);
      break;
    case 8:
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)__return_storage_ptr__,"SHT_NOBITS",&local_35);
      std::allocator<char>::~allocator((allocator<char> *)&local_35);
      break;
    case 9:
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)__return_storage_ptr__,"SHT_REL",&local_36);
      std::allocator<char>::~allocator((allocator<char> *)&local_36);
      break;
    default:
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)__return_storage_ptr__,"UNKNOWN",&local_38);
      std::allocator<char>::~allocator((allocator<char> *)&local_38);
      break;
    case 0xb:
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)__return_storage_ptr__,"SHT_DYNSYM",&local_37);
      std::allocator<char>::~allocator((allocator<char> *)&local_37);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Elf_parser::get_section_type(int tt) {
    if(tt < 0)
        return "UNKNOWN";

    switch(tt) {
        case 0: return "SHT_NULL";      /* Section header table entry unused */
        case 1: return "SHT_PROGBITS";  /* Program data */
        case 2: return "SHT_SYMTAB";    /* Symbol table */
        case 3: return "SHT_STRTAB";    /* String table */
        case 4: return "SHT_RELA";      /* Relocation entries with addends */
        case 5: return "SHT_HASH";      /* Symbol hash table */
        case 6: return "SHT_DYNAMIC";   /* Dynamic linking information */
        case 7: return "SHT_NOTE";      /* Notes */
        case 8: return "SHT_NOBITS";    /* Program space with no data (bss) */
        case 9: return "SHT_REL";       /* Relocation entries, no addends */
        case 11: return "SHT_DYNSYM";   /* Dynamic linker symbol table */
        default: return "UNKNOWN";
    }
    return "UNKNOWN";
}